

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int vm_builtin_get_defined_constants(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_vm *pjVar1;
  SyHashEntry_Pr *pSVar2;
  sxi32 sVar3;
  jx9_value *pSrc;
  uint uVar4;
  SyHashEntry_Pr **ppSVar5;
  anon_union_8_3_18420de5_for_x local_78;
  undefined8 uStack_70;
  jx9_vm *local_68;
  jx9_vm *pjStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pSrc = jx9_context_new_array(pCtx);
  if (pSrc == (jx9_value *)0x0) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    pjVar1 = pCtx->pVm;
    if ((pjVar1->hConstant).nEntry != 0) {
      ppSVar5 = &(pjVar1->hConstant).pList;
      uVar4 = 0;
      do {
        pSVar2 = *ppSVar5;
        local_68 = pSrc->pVm;
        uStack_40 = 0;
        local_78.rVal = 0.0;
        local_58 = 0;
        uStack_50 = 0;
        local_48 = 0;
        uStack_70 = 1;
        pjStack_60 = local_68;
        jx9MemObjStringAppend((jx9_value *)&local_78,(char *)pSVar2->pKey,pSVar2->nKeyLen);
        if ((pSrc->iFlags & 0x40) == 0) {
          jx9MemObjRelease((jx9_value *)&local_78);
          break;
        }
        sVar3 = HashmapInsert((jx9_hashmap *)(pSrc->x).pOther,(jx9_value *)0x0,
                              (jx9_value *)&local_78);
        jx9MemObjRelease((jx9_value *)&local_78);
        if (sVar3 != 0) break;
        ppSVar5 = &pSVar2->pNext;
        uVar4 = uVar4 + 1;
      } while (uVar4 < (pjVar1->hConstant).nEntry);
    }
    jx9MemObjStore(pSrc,pCtx->pRet);
  }
  return 0;
}

Assistant:

static int vm_builtin_get_defined_constants(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray;
	/* Create the array first*/
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* Return NULL */
		jx9_result_null(pCtx);
		return SXRET_OK;
	}
	/* Fill the array with the defined constants */
	SyHashForEach(&pCtx->pVm->hConstant, VmHashConstStep, pArray);
	/* Return the created array */
	jx9_result_value(pCtx, pArray);
	return SXRET_OK;
}